

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_cell_add_local(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  REF_INT new_cell;
  REF_INT local_c;
  
  lVar4 = (long)ref_cell->node_per;
  if (0 < lVar4) {
    lVar5 = 0;
    bVar6 = false;
    do {
      while (bVar6) {
        lVar5 = lVar5 + 1;
        bVar6 = true;
        if (lVar5 == lVar4) goto LAB_0018c8d0;
      }
      iVar2 = ref_node->ref_mpi->id;
      piVar1 = nodes + lVar5;
      bVar6 = iVar2 == ref_node->part[*piVar1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4);
    if (iVar2 == ref_node->part[*piVar1]) {
LAB_0018c8d0:
      uVar3 = ref_cell_add(ref_cell,nodes,&local_c);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x1c6,"ref_shard_cell_add_local",(ulong)uVar3,"add");
        return uVar3;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_cell_add_local(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes) {
  REF_BOOL has_local;
  REF_INT node, new_cell;

  has_local = REF_FALSE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    has_local = has_local || (ref_mpi_rank(ref_node_mpi(ref_node)) ==
                              ref_node_part(ref_node, nodes[node]));

  if (has_local) RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");

  return REF_SUCCESS;
}